

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceGLImpl::CreateBufferFromGLHandle
          (RenderDeviceGLImpl *this,Uint32 GLHandle,BufferDesc *BuffDesc,RESOURCE_STATE InitialState
          ,IBuffer **ppBuffer)

{
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  string msg;
  bool local_51;
  undefined1 local_50 [16];
  string local_40;
  
  local_50._12_4_ = GLHandle;
  if (GLHandle == 0) {
    FormatString<char[34]>
              ((string *)(local_50 + 0x10),(char (*) [34])"GL buffer handle must not be null");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateBufferFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x175);
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
  }
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)local_50,(size_t)this);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    FormatString<char[44]>
              ((string *)(local_50 + 0x10),
               (char (*) [44])"Immediate device context has been destroyed");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateBufferFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x178);
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
  }
  local_40._M_dataplus._M_p = (pointer)(local_50._0_8_ + 0x750);
  local_51 = false;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateBufferImpl<std::reference_wrapper<Diligent::GLContextState>,unsigned_int,bool>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,ppBuffer,BuffDesc,
             (reference_wrapper<Diligent::GLContextState> *)(local_50 + 0x10),
             (uint *)(local_50 + 0xc),&local_51);
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)local_50);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateBufferFromGLHandle(Uint32 GLHandle, const BufferDesc& BuffDesc, RESOURCE_STATE InitialState, IBuffer** ppBuffer)
{
    DEV_CHECK_ERR(GLHandle != 0, "GL buffer handle must not be null");

    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    CreateBufferImpl(ppBuffer, BuffDesc, std::ref(pDeviceContext->GetContextState()), GLHandle, /*bIsDeviceInternal =*/false);
}